

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

void __thiscall CppGenerator::computeViewLevel(CppGenerator *this,size_t group_id,TDNode *node)

{
  bool bVar1;
  size_type sVar2;
  reference ppAVar3;
  reference puVar4;
  size_type in_RSI;
  long in_RDI;
  var_bitset viewJoinVars;
  View *incView;
  size_t *incViewID;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  var_bitset intersection;
  size_t *var_2;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  var_bitset coveredVariableOrder;
  size_t depth;
  Function *otherFunction;
  size_t f2;
  prod_bitset overlapFunc;
  var_bitset overlapVars;
  bool overlaps;
  size_t var_1;
  var_bitset dependentFunctionVars;
  Function *function;
  size_t f;
  prod_bitset considered;
  prod_bitset *product;
  size_t i;
  Aggregate *aggregate;
  size_t aggNo;
  var_bitset nonJoinVars;
  size_t var;
  var_bitset dependentViewVars;
  var_bitset varsToCover;
  bool setViewLevel;
  View *view;
  size_t *viewID;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  var_bitset *varOrderBitset;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *varOrder;
  undefined7 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb7f;
  QueryCompiler *in_stack_fffffffffffffb80;
  bitset<1500UL> *in_stack_fffffffffffffb88;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffb90;
  size_type in_stack_fffffffffffffb98;
  vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *in_stack_fffffffffffffba0;
  undefined1 value;
  undefined4 in_stack_fffffffffffffba8;
  uint uVar5;
  undefined1 in_stack_fffffffffffffbac;
  undefined1 in_stack_fffffffffffffbad;
  undefined1 in_stack_fffffffffffffbae;
  undefined1 in_stack_fffffffffffffbaf;
  byte bVar6;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffbb0;
  ulong uVar7;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3c8;
  long local_3c0;
  _Base_bitset<2UL> local_3b8;
  _Base_bitset<2UL> local_3a8;
  reference local_398;
  unsigned_long *local_390;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_388;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_380;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_368;
  _Base_bitset<2UL> local_360;
  Function *local_350;
  byte local_345;
  reference local_338;
  byte local_321;
  reference local_320;
  ulong local_310;
  _WordT local_248;
  _WordT local_240;
  byte local_231;
  _Base_bitset<2UL> local_230;
  reference local_220;
  ulong local_210;
  _Base_bitset<2UL> local_1f8;
  Function *local_1e8;
  byte local_1d9;
  reference local_1d8;
  ulong local_1c8;
  reference local_100;
  ulong local_f8;
  value_type local_f0;
  ulong local_e8;
  _Base_bitset<2UL> local_e0;
  _Base_bitset<2UL> local_d0;
  _Base_bitset<2UL> local_c0;
  _Base_bitset<2UL> local_b0;
  _Base_bitset<2UL> local_a0;
  reference local_90;
  ulong local_80;
  _WordT local_68;
  _WordT local_60;
  byte local_51;
  View *local_50;
  reference local_48;
  unsigned_long *local_40;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38;
  reference local_30;
  reference local_28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_20;
  size_type local_10;
  
  local_20 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             (*(long *)(in_RDI + 0xb8) + in_RSI * 0x18);
  local_10 = in_RSI;
  local_28 = std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::operator[]
                       ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)
                        (in_RDI + 0xd0),in_RSI);
  std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::clear
            ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)0x2b4154);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::resize
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  value = (undefined1)((ulong)in_stack_fffffffffffffba0 >> 0x38);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
            (in_stack_fffffffffffffb90);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2b41bf);
  QueryCompiler::numberOfViews((QueryCompiler *)0x2b41c7);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (in_stack_fffffffffffffbb0,
             CONCAT17(in_stack_fffffffffffffbaf,
                      CONCAT16(in_stack_fffffffffffffbae,
                               CONCAT15(in_stack_fffffffffffffbad,
                                        CONCAT14(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8
                                                )))),(bool)value);
  local_30 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RDI + 0xf0),local_10);
  local_38._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
  local_40 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_fffffffffffffb80,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78)), bVar1
        ) {
    local_48 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_38);
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2b426c);
    local_50 = QueryCompiler::getView
                         (in_stack_fffffffffffffb80,
                          CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
    local_51 = 0;
    bVar1 = std::bitset<100UL>::none((bitset<100UL> *)0x2b42a0);
    if (bVar1) {
      sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
      *(size_type *)(*(long *)(in_RDI + 0xb0) + *local_48 * 8) = sVar2;
      local_51 = 1;
    }
    local_68 = (local_50->_fVars).super__Base_bitset<2UL>._M_w[0];
    local_60 = (local_50->_fVars).super__Base_bitset<2UL>._M_w[1];
    std::bitset<100UL>::bitset((bitset<100UL> *)0x2b4306);
    for (local_80 = 0; local_80 < 100; local_80 = local_80 + 1) {
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)in_stack_fffffffffffffb88,(size_t)in_stack_fffffffffffffb80);
      bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffb80);
      std::bitset<100UL>::reference::~reference(&local_90);
      if (bVar1) {
        std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::operator[]
                  ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)
                   (in_RDI + 0x298),local_80);
        std::bitset<100UL>::operator|=
                  ((bitset<100UL> *)in_stack_fffffffffffffb80,
                   (bitset<100UL> *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
      }
    }
    local_a0._M_w =
         (_WordT  [2])std::bitset<100UL>::operator~((bitset<100UL> *)in_stack_fffffffffffffb88);
    std::bitset<100UL>::operator&=
              ((bitset<100UL> *)in_stack_fffffffffffffb80,
               (bitset<100UL> *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
    local_d0._M_w =
         (_WordT  [2])std::bitset<100UL>::operator~((bitset<100UL> *)in_stack_fffffffffffffb88);
    local_c0._M_w =
         (_WordT  [2])
         std::operator&((bitset<100UL> *)
                        CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                        (bitset<100UL> *)0x2b4420);
    local_e0._M_w =
         (_WordT  [2])std::bitset<100UL>::operator~((bitset<100UL> *)in_stack_fffffffffffffb88);
    local_b0._M_w =
         (_WordT  [2])
         std::operator&((bitset<100UL> *)
                        CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                        (bitset<100UL> *)0x2b4466);
    bVar1 = std::bitset<100UL>::any((bitset<100UL> *)0x2b4483);
    if (bVar1) {
      for (local_e8 = 0; uVar7 = local_e8,
          sVar2 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::size
                            (&local_50->_aggregates), uVar7 < sVar2; local_e8 = local_e8 + 1) {
        ppAVar3 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                            (&local_50->_aggregates,local_e8);
        local_f0 = *ppAVar3;
        local_f8 = 0;
        while (uVar7 = local_f8,
              sVar2 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::size
                                (&local_f0->_agg), uVar7 < sVar2) {
          local_100 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::
                      operator[](&local_f0->_agg,local_f8);
          std::bitset<1500UL>::bitset((bitset<1500UL> *)0x2b454c);
          for (local_1c8 = 0; local_1c8 < 0x5dc; local_1c8 = local_1c8 + 1) {
            bVar1 = std::bitset<1500UL>::test
                              ((bitset<1500UL> *)in_stack_fffffffffffffb80,
                               CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
            local_1d9 = 0;
            bVar6 = 0;
            if (bVar1) {
              std::bitset<1500UL>::operator[]
                        (in_stack_fffffffffffffb88,(size_t)in_stack_fffffffffffffb80);
              local_1d9 = 1;
              bVar1 = std::bitset::reference::operator_cast_to_bool
                                ((reference *)in_stack_fffffffffffffb80);
              bVar6 = bVar1 ^ 0xff;
            }
            if ((local_1d9 & 1) != 0) {
              std::bitset<1500UL>::reference::~reference(&local_1d8);
            }
            if ((bVar6 & 1) != 0) {
              std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2b460a);
              local_1e8 = QueryCompiler::getFunction
                                    (in_stack_fffffffffffffb80,
                                     CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
              local_1f8._M_w =
                   (_WordT  [2])
                   std::operator&((bitset<100UL> *)
                                  CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                                  (bitset<100UL> *)0x2b4637);
              bVar1 = std::bitset<100UL>::any((bitset<100UL> *)0x2b4654);
              if (bVar1) {
                std::bitset<100UL>::bitset((bitset<100UL> *)0x2b466a);
                for (local_210 = 0; local_210 < 100; local_210 = local_210 + 1) {
                  std::bitset<100UL>::operator[]
                            ((bitset<100UL> *)in_stack_fffffffffffffb88,
                             (size_t)in_stack_fffffffffffffb80);
                  bVar6 = std::bitset::reference::operator_cast_to_bool
                                    ((reference *)in_stack_fffffffffffffb80);
                  std::bitset<100UL>::reference::~reference(&local_220);
                  if ((bVar6 & 1) != 0) {
                    std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::
                    operator[]((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)
                               (in_RDI + 0x298),local_210);
                    std::bitset<100UL>::operator|=
                              ((bitset<100UL> *)in_stack_fffffffffffffb80,
                               (bitset<100UL> *)
                               CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
                  }
                }
                local_230._M_w =
                     (_WordT  [2])
                     std::bitset<100UL>::operator~((bitset<100UL> *)in_stack_fffffffffffffb88);
                std::bitset<100UL>::operator&=
                          ((bitset<100UL> *)in_stack_fffffffffffffb80,
                           (bitset<100UL> *)
                           CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
                local_248 = (local_1e8->_fVars).super__Base_bitset<2UL>._M_w[0];
                local_240 = (local_1e8->_fVars).super__Base_bitset<2UL>._M_w[1];
                std::bitset<1500UL>::bitset((bitset<1500UL> *)0x2b476c);
                std::bitset<1500UL>::set
                          ((bitset<1500UL> *)in_stack_fffffffffffffb90,
                           (size_t)in_stack_fffffffffffffb88,
                           SUB81((ulong)in_stack_fffffffffffffb80 >> 0x38,0));
                do {
                  local_231 = 0;
                  std::bitset<100UL>::operator|=
                            ((bitset<100UL> *)in_stack_fffffffffffffb80,
                             (bitset<100UL> *)
                             CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
                  for (local_310 = 0; local_310 < 0x5dc; local_310 = local_310 + 1) {
                    bVar1 = std::bitset<1500UL>::operator[]
                                      ((bitset<1500UL> *)in_stack_fffffffffffffb80,
                                       CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78)
                                      );
                    local_321 = 0;
                    local_345 = 0;
                    bVar6 = 0;
                    if (bVar1) {
                      std::bitset<1500UL>::operator[]
                                (in_stack_fffffffffffffb88,(size_t)in_stack_fffffffffffffb80);
                      local_321 = 1;
                      bVar1 = std::bitset::reference::operator_cast_to_bool
                                        ((reference *)in_stack_fffffffffffffb80);
                      bVar6 = 0;
                      if (!bVar1) {
                        std::bitset<1500UL>::operator[]
                                  (in_stack_fffffffffffffb88,(size_t)in_stack_fffffffffffffb80);
                        local_345 = 1;
                        bVar1 = std::bitset::reference::operator_cast_to_bool
                                          ((reference *)in_stack_fffffffffffffb80);
                        bVar6 = bVar1 ^ 0xff;
                      }
                    }
                    uVar5 = (uint)bVar6 << 0x18;
                    if ((local_345 & 1) != 0) {
                      std::bitset<1500UL>::reference::~reference(&local_338);
                    }
                    if ((local_321 & 1) != 0) {
                      std::bitset<1500UL>::reference::~reference(&local_320);
                    }
                    if ((uVar5 & 0x1000000) != 0) {
                      std::
                      __shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x2b48c3);
                      local_350 = QueryCompiler::getFunction
                                            (in_stack_fffffffffffffb80,
                                             CONCAT17(in_stack_fffffffffffffb7f,
                                                      in_stack_fffffffffffffb78));
                      local_360._M_w =
                           (_WordT  [2])
                           std::operator&((bitset<100UL> *)
                                          CONCAT17(in_stack_fffffffffffffb7f,
                                                   in_stack_fffffffffffffb78),
                                          (bitset<100UL> *)0x2b48f0);
                      bVar1 = std::bitset<100UL>::any((bitset<100UL> *)0x2b490d);
                      if (bVar1) {
                        std::bitset<1500UL>::set
                                  ((bitset<1500UL> *)in_stack_fffffffffffffb90,
                                   (size_t)in_stack_fffffffffffffb88,
                                   SUB81((ulong)in_stack_fffffffffffffb80 >> 0x38,0));
                        std::bitset<1500UL>::set
                                  ((bitset<1500UL> *)in_stack_fffffffffffffb90,
                                   (size_t)in_stack_fffffffffffffb88,
                                   SUB81((ulong)in_stack_fffffffffffffb80 >> 0x38,0));
                        local_231 = 1;
                        std::bitset<100UL>::operator|=
                                  ((bitset<100UL> *)in_stack_fffffffffffffb80,
                                   (bitset<100UL> *)
                                   CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
                      }
                    }
                  }
                } while ((local_231 & 1) != 0);
                std::bitset<100UL>::operator|=
                          ((bitset<100UL> *)in_stack_fffffffffffffb80,
                           (bitset<100UL> *)
                           CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
              }
            }
          }
          local_f8 = local_f8 + 1;
        }
      }
    }
    local_368 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    std::bitset<100UL>::bitset((bitset<100UL> *)0x2b4a4b);
    local_380 = local_20;
    local_388._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
    local_390 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffb80,
                              (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78)),
          bVar1) {
      local_398 = __gnu_cxx::
                  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&local_388);
      std::bitset<100UL>::set
                ((bitset<100UL> *)in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88,
                 SUB81((ulong)in_stack_fffffffffffffb80 >> 0x38,0));
      std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::operator[]
                ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)
                 (in_RDI + 0x2b0),(size_type)local_368);
      std::bitset<100UL>::set
                ((bitset<100UL> *)in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88,
                 SUB81((ulong)in_stack_fffffffffffffb80 >> 0x38,0));
      local_3a8._M_w =
           (_WordT  [2])
           std::operator&((bitset<100UL> *)
                          CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                          (bitset<100UL> *)0x2b4b1f);
      local_3b8._M_w =
           (_WordT  [2])
           std::operator&((bitset<100UL> *)
                          CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                          (bitset<100UL> *)0x2b4b44);
      bVar1 = std::bitset<100UL>::operator==
                        ((bitset<100UL> *)in_stack_fffffffffffffb80,
                         (bitset<100UL> *)
                         CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
      if (bVar1) {
        std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::operator[]
                  ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)
                   (in_RDI + 0x2b0),(size_type)local_368);
        std::bitset<100UL>::operator|=
                  ((bitset<100UL> *)in_stack_fffffffffffffb80,
                   (bitset<100UL> *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
      }
      local_3c0 = *(long *)(in_RDI + 0xa8) + *local_48 * 0x18;
      local_3c8._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffb80,
                                (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78)),
            bVar1) {
        puVar4 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_3c8);
        std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x2b4c34);
        QueryCompiler::getView
                  (in_stack_fffffffffffffb80,
                   CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
        std::operator&((bitset<100UL> *)
                       CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                       (bitset<100UL> *)0x2b4c68);
        std::operator&((bitset<100UL> *)
                       CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                       (bitset<100UL> *)0x2b4c8d);
        bVar1 = std::bitset<100UL>::operator==
                          ((bitset<100UL> *)in_stack_fffffffffffffb80,
                           (bitset<100UL> *)
                           CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
        if (bVar1) {
          in_stack_fffffffffffffb88 = (bitset<1500UL> *)(in_RDI + 0x2c8);
          in_stack_fffffffffffffb80 = (QueryCompiler *)*puVar4;
          in_stack_fffffffffffffb90 = local_368;
          std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )0x2b4cf4);
          QueryCompiler::numberOfViews((QueryCompiler *)0x2b4cfc);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                    (in_stack_fffffffffffffb90,(size_type)in_stack_fffffffffffffb88,
                     SUB81((ulong)in_stack_fffffffffffffb80 >> 0x38,0));
          std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::operator[]
                    ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)
                     (in_RDI + 0x2b0),(size_type)local_368);
          std::bitset<100UL>::operator|=
                    ((bitset<100UL> *)in_stack_fffffffffffffb80,
                     (bitset<100UL> *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78))
          ;
        }
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_3c8);
      }
      in_stack_fffffffffffffb7f = false;
      if ((local_51 & 1) == 0) {
        std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::operator[]
                  ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)
                   (in_RDI + 0x2b0),(size_type)local_368);
        std::operator&((bitset<100UL> *)
                       CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                       (bitset<100UL> *)0x2b4da7);
        in_stack_fffffffffffffb7f =
             std::bitset<100UL>::operator==
                       ((bitset<100UL> *)in_stack_fffffffffffffb80,
                        (bitset<100UL> *)
                        CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
      }
      if ((bool)in_stack_fffffffffffffb7f != false) {
        *(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> **)
         (*(long *)(in_RDI + 0xb0) + *local_48 * 8) = local_368;
        local_51 = 1;
      }
      local_368 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                  ((long)&(local_368->m_bits).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + 1);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_388);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

void CppGenerator::computeViewLevel(size_t group_id, const TDNode& node)
{
    const std::vector<size_t>& varOrder = groupVariableOrder[group_id];
    const var_bitset& varOrderBitset = groupVariableOrderBitset[group_id];

    coveredVariables.clear();
    coveredVariables.resize(varOrder.size());
    
    addableViews.reset();
    addableViews.resize(varOrder.size() * (_qc->numberOfViews()+1));

    for (const size_t& viewID : viewGroups[group_id])
    {
        View* view = _qc->getView(viewID);
        bool setViewLevel = false;
        
        // if this view has no free variables it should be outputted before the join 
        if (view->_fVars.none())
        {
            viewLevelRegister[viewID] = varOrder.size();
            setViewLevel = true;
        }
        
        var_bitset varsToCover = view->_fVars;

        var_bitset dependentViewVars;
        for (size_t var=0; var<NUM_OF_VARIABLES;++var)
        {
            if (view->_fVars[var])
                dependentViewVars |= variableDependency[var];
        }
        dependentViewVars &= ~varOrderBitset;

        // TODO: (consider) should we check for overlap for bag vars that are
        // not in varOrder?
        var_bitset nonJoinVars = view->_fVars & ~varOrderBitset & ~node._bag;
        
        if (nonJoinVars.any())
        {
            //  if this is the case then look for overlapping functions
            for (size_t aggNo = 0; aggNo < view->_aggregates.size(); ++aggNo)
            {
                Aggregate* aggregate = view->_aggregates[aggNo];

                for (size_t i = 0; i < aggregate->_agg.size(); ++i)
                {
                    const prod_bitset& product = aggregate->_agg[i];
                    prod_bitset considered;
                        
                    for (size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
                    {
                        if (product.test(f) && !considered[f])
                        {
                            Function* function = _qc->getFunction(f);
                                
                            // check if this function is covered
                            if ((function->_fVars & dependentViewVars).any())
                            {
                                var_bitset dependentFunctionVars;
                                for (size_t var=0; var<NUM_OF_VARIABLES;++var)
                                {
                                    if (function->_fVars[var])
                                        dependentFunctionVars |= variableDependency[var];
                                }
                                dependentFunctionVars &= ~varOrderBitset;

                                // if it is - find functions that overlap
                                bool overlaps;
                                var_bitset overlapVars = function->_fVars;
                                prod_bitset overlapFunc;
                                overlapFunc.set(f);

                                do
                                {
                                    overlaps = false;
                                    overlapVars |= function->_fVars;

                                    for (size_t f2 = 0; f2 < NUM_OF_FUNCTIONS; ++f2)
                                    {
                                        if (product[f2] && !considered[f2] && !overlapFunc[f2])
                                        {
                                            Function* otherFunction = _qc->getFunction(f);
                                            // check if functions overlap
                                            if ((otherFunction->_fVars & dependentFunctionVars).any())
                                            {
                                                considered.set(f2);
                                                overlapFunc.set(f2);
                                                overlaps = true;
                                                overlapVars |= otherFunction->_fVars;
                                            }
                                        }
                                    }
                                } while(overlaps);

                                varsToCover |= overlapVars;
                            }
                        }
                    }                        
                }    
            }
        }
        
        // check when the freeVars of the view are covered - this determines
        // when we need to add the declaration of aggregate array and push to
        // view vector !
        size_t depth = 0;
        var_bitset coveredVariableOrder;
 
        for (const size_t& var : varOrder)
        {
            coveredVariableOrder.set(var);
            coveredVariables[depth].set(var);
            
            var_bitset intersection = node._bag & varOrderBitset;
            if ((intersection & coveredVariableOrder) == intersection) 
                coveredVariables[depth] |= node._bag;

            for (const size_t& incViewID : incomingViews[viewID]) 
            {
                // check if view is covered !
                View* incView = _qc->getView(incViewID);
                
                var_bitset viewJoinVars = incView->_fVars & varOrderBitset;
                if ((viewJoinVars & coveredVariableOrder) == viewJoinVars) 
                {
                    addableViews.set(incViewID + (depth * (_qc->numberOfViews()+1)));
                    coveredVariables[depth] |= incView->_fVars;
                }
            }

            if (!setViewLevel && (varsToCover & coveredVariables[depth]) == varsToCover)
            {
                // this is the depth where we add the declaration of aggregate
                // array and push to the vector !
                viewLevelRegister[viewID] = depth;
                setViewLevel = true;
            }
            ++depth;
        }
    }
}